

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

void Rtm_ObjAddFirst(Rtm_Man_t *p,Rtm_Edg_t *pEdge,Rtm_Init_t Val)

{
  Rtm_Init_t *pRVar1;
  Rtm_Init_t RVar2;
  Rtm_Init_t *pRVar3;
  uint uVar4;
  uint uVar5;
  
  if ((*(uint *)pEdge & 0xfff) == 10) {
    Rtm_ObjTransferToBig(p,pEdge);
  }
  else if ((~*(uint *)pEdge & 0xf) == 0) {
    Rtm_ObjTransferToBigger(p,pEdge);
  }
  uVar5 = *(uint *)pEdge;
  uVar4 = uVar5 + 1 & 0xfff;
  if ((uVar5 & 0xffe) < 10) {
    *(Rtm_Init_t *)pEdge = (uVar5 >> 10 & 0xffffc | Val) << 0xc | uVar4;
  }
  else {
    pRVar3 = p->pExtra + (uVar5 >> 0xc);
    *(uint *)pEdge = uVar5 & 0xfffff000 | uVar4;
    uVar5 = ((uVar4 >> 4) + 1) - (uint)((uVar5 + 1 & 0xf) == 0);
    if (uVar5 != 0) {
      pRVar1 = pRVar3 + uVar5;
      do {
        RVar2 = *pRVar3;
        *pRVar3 = RVar2 << 2 | Val;
        pRVar3 = pRVar3 + 1;
        Val = RVar2 >> 0x1e;
      } while (pRVar3 < pRVar1);
    }
  }
  return;
}

Assistant:

static        void        Rtm_ObjAddFirst( Rtm_Man_t * p, Rtm_Edg_t * pEdge, Rtm_Init_t Val )  { if ( pEdge->nLats == 10 ) Rtm_ObjTransferToBig(p, pEdge); else if ( (pEdge->nLats & 15) == 15 ) Rtm_ObjTransferToBigger(p, pEdge); if ( pEdge->nLats >= 10 ) Rtm_ObjAddFirst2(p, pEdge, Val); else Rtm_ObjAddFirst1(pEdge, Val); }